

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

int INT_EVdfg_assign_node(EVdfg_stone stone,char *node_name)

{
  EVmaster p_Var1;
  FILE *__stream;
  EVdfg_config_action act_00;
  int iVar2;
  __pid_t _Var3;
  pthread_t pVar4;
  char **ppcVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  EVdfg p_Var9;
  EVdfg_config_action act;
  timespec local_50;
  int local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  p_Var9 = stone->dfg;
  p_Var1 = p_Var9->master;
  iVar6 = p_Var1->node_count;
  if (0 < (long)iVar6) {
    ppcVar5 = &p_Var1->nodes->canonical_name;
    uVar7 = 0xffffffff;
    uVar8 = 0;
    do {
      if ((*ppcVar5 == (char *)0x0) || (iVar2 = strcmp(*ppcVar5,node_name), iVar2 != 0)) {
        if ((((_EVint_node_rec *)(ppcVar5 + -1))->name != (char *)0x0) &&
           (iVar2 = strcmp(((_EVint_node_rec *)(ppcVar5 + -1))->name,node_name), iVar2 == 0)) {
          uVar7 = uVar8 & 0xffffffff;
        }
      }
      else {
        uVar7 = uVar8 & 0xffffffff;
      }
      uVar8 = uVar8 + 1;
      ppcVar5 = ppcVar5 + 7;
    } while ((long)iVar6 != uVar8);
    iVar6 = (int)uVar7;
    if (iVar6 != -1) {
      if (p_Var9->realized == 1) {
        iVar2 = CMtrace_val[0xd];
        if (p_Var1->cm->CMTrace_file == (FILE *)0x0) {
          iVar2 = CMtrace_init(p_Var1->cm,EVdfgVerbose);
        }
        if (iVar2 != 0) {
          if (CMtrace_PID != 0) {
            __stream = (FILE *)p_Var1->cm->CMTrace_file;
            _Var3 = getpid();
            pVar4 = pthread_self();
            fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_50);
            fprintf((FILE *)p_Var1->cm->CMTrace_file,"%lld.%.9ld - ",
                    CONCAT44(local_50.tv_sec._4_4_,(undefined4)local_50.tv_sec),local_50.tv_nsec);
          }
          fprintf((FILE *)p_Var1->cm->CMTrace_file,"assign node, node# = %d\n",uVar7);
        }
        fflush((FILE *)p_Var1->cm->CMTrace_file);
        p_Var9 = stone->dfg;
      }
      local_50.tv_sec._0_4_ = 0xc;
      local_50.tv_sec._4_4_ = stone->stone_id;
      act_00.stone_id = local_50.tv_sec._4_4_;
      act_00.type = 0xc;
      act_00.u.period.usecs = uStack_3c;
      act_00.u.period.secs = iVar6;
      act_00._8_8_ = local_50.tv_nsec;
      act_00.u._8_8_ = uStack_38;
      local_40 = iVar6;
      EVdfg_perform_act_on_state(p_Var9->working_state,act_00,1);
      return 1;
    }
  }
  printf("Node \"%s\" not found in node list\n",node_name);
  return 0;
}

Assistant:

extern int
INT_EVdfg_assign_node(EVdfg_stone stone, char *node_name)
{
    EVdfg dfg = stone->dfg;
    EVmaster master = dfg->master;
    int i, node = -1;
    for (i = 0; i < master->node_count; i++) {
	EVint_node_list n = &master->nodes[i];
	if (n->canonical_name && (strcmp(n->canonical_name, node_name) == 0)) {
	    node = i;
	} else 	if (n->name && (strcmp(n->name, node_name) == 0)) {
	    node = i;
	}

    }
    if (node == -1) {
	printf("Node \"%s\" not found in node list\n", node_name);
	return 0;
    }
	
    if (dfg->realized == 1) {
	CMtrace_out(master->cm, EVdfgVerbose, "assign node, node# = %d\n", node);
    }
    EVdfg_config_action act;
    act.type = ACT_assign_node;
    act.stone_id = stone->stone_id;
    act.u.assign.dest_node = node;
    (void) EVdfg_perform_act_on_state(stone->dfg->working_state, act, 1 /* add to queue */);
    return 1;
}